

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O1

int duckdb::UnaryLambdaWrapper::
    Operation<IntToMinMaxCast(duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&)::__0,int,int>
              (int input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  ConversionException *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  undefined1 *local_c0 [2];
  undefined1 local_b0 [16];
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if ((**(int **)mask <= input) && (input <= **(int **)(mask + 8))) {
    return input;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  local_c0[0] = local_b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c0,"Value %s is outside of range [%s,%s]","");
  std::__cxx11::to_string(&local_60,input);
  std::__cxx11::to_string(&local_80,**(int **)mask);
  std::__cxx11::to_string(&local_a0,**(int **)(mask + 8));
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (&local_40,(StringUtil *)local_c0,&local_60,&local_80,&local_a0,in_R9);
  duckdb::ConversionException::ConversionException(this,(string *)&local_40);
  __cxa_throw(this,&ConversionException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto fun = (FUNC *)dataptr;
		return (*fun)(input);
	}